

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O2

bool __thiscall VideoHppGenerator::isExtension(VideoHppGenerator *this,string *name)

{
  pointer pEVar1;
  pointer pEVar2;
  __type_conflict _Var3;
  pointer pEVar4;
  
  pEVar1 = (this->m_extensions).
           super__Vector_base<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar2 = (this->m_extensions).
           super__Vector_base<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pEVar4 = pEVar2;
    if (pEVar4 == pEVar1) break;
    _Var3 = std::operator==(&pEVar4->name,name);
    pEVar2 = pEVar4 + 1;
  } while (!_Var3);
  return pEVar4 != pEVar1;
}

Assistant:

bool VideoHppGenerator::isExtension( std::string const & name ) const
{
  return std::ranges::any_of( m_extensions, [&name]( ExtensionData const & ed ) { return ed.name == name; } );
}